

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Graph.cpp
# Opt level: O0

void __thiscall GraphTest::SetUp(GraphTest *this)

{
  int local_40 [12];
  GraphTest *local_10;
  GraphTest *this_local;
  
  local_40[0xb] = 0;
  local_40[10] = 1;
  local_10 = this;
  graph::Graph<int>::add_edge(&this->graph,local_40 + 0xb,local_40 + 10);
  local_40[9] = 0;
  local_40[8] = 2;
  graph::Graph<int>::add_edge(&this->graph,local_40 + 9,local_40 + 8);
  local_40[7] = 1;
  local_40[6] = 3;
  graph::Graph<int>::add_edge(&this->graph,local_40 + 7,local_40 + 6);
  local_40[5] = 1;
  local_40[4] = 4;
  graph::Graph<int>::add_edge(&this->graph,local_40 + 5,local_40 + 4);
  local_40[3] = 3;
  local_40[2] = 5;
  graph::Graph<int>::add_edge(&this->graph,local_40 + 3,local_40 + 2);
  local_40[1] = 4;
  local_40[0] = 5;
  graph::Graph<int>::add_edge(&this->graph,local_40 + 1,local_40);
  return;
}

Assistant:

void SetUp() {
        graph.add_edge(0, 1);
        graph.add_edge(0, 2);
        graph.add_edge(1, 3);
        graph.add_edge(1, 4);
        graph.add_edge(3, 5);
        graph.add_edge(4, 5);
    }